

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

void * mspace_malloc(mspace msp,size_t bytes)

{
  byte *pbVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  malloc_chunk *pmVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  undefined8 *puVar10;
  void *pvVar11;
  undefined8 *puVar12;
  mchunkptr pmVar13;
  long *plVar14;
  msegmentptr pmVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  malloc_chunk *pmVar19;
  size_t dvs;
  long *plVar20;
  uint uVar21;
  uint uVar22;
  mchunkptr pmVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  mchunkptr pmVar27;
  long lVar28;
  undefined8 *puVar29;
  undefined8 *puVar30;
  ulong uVar31;
  undefined8 *puVar32;
  size_t sVar33;
  malloc_chunk *pmVar34;
  malloc_chunk *pmVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  
  if (bytes < 0xe9) {
    uVar17 = *msp;
    uVar25 = 0x20;
    if (0x16 < bytes) {
      uVar25 = (ulong)((int)bytes + 0x17U & 0x1f0);
    }
    uVar22 = (uint)(uVar25 >> 3);
    uVar21 = uVar17 >> (uVar22 & 0x1f);
    if ((uVar21 & 3) != 0) {
      uVar22 = (uVar21 & 1 | uVar22) ^ 1;
      uVar25 = (long)msp + (ulong)(uVar22 << 4) + 0x48;
      lVar28 = *(long *)(uVar25 + 0x10);
      uVar18 = *(ulong *)(lVar28 + 0x10);
      if (uVar25 == uVar18) {
        *(uint *)msp = uVar17 & ~(1 << (uVar22 & 0x1f));
      }
      else {
        if ((uVar18 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar18 + 0x18) != lVar28))
        goto LAB_0013519f;
        *(ulong *)(uVar18 + 0x18) = uVar25;
        *(ulong *)(uVar25 + 0x10) = uVar18;
      }
      *(ulong *)(lVar28 + 8) = (ulong)(uVar22 << 3) + 3;
      pbVar1 = (byte *)(lVar28 + 8 + (ulong)(uVar22 << 3));
      *pbVar1 = *pbVar1 | 1;
      return (void *)(lVar28 + 0x10);
    }
    uVar18 = *(ulong *)((long)msp + 8);
    if (uVar18 < uVar25) {
      if (uVar21 != 0) {
        uVar9 = 2 << (uVar22 & 0x1f);
        uVar6 = 0;
        for (uVar22 = (-uVar9 | uVar9) & uVar21 << (uVar22 & 0x1f); (uVar22 & 1) == 0;
            uVar22 = uVar22 >> 1 | 0x80000000) {
          uVar6 = uVar6 + 1;
        }
        uVar24 = (long)msp + (ulong)(uVar6 << 4) + 0x48;
        lVar28 = *(long *)(uVar24 + 0x10);
        uVar31 = *(ulong *)(lVar28 + 0x10);
        if (uVar24 == uVar31) {
          uVar17 = uVar17 & ~(1 << (uVar6 & 0x1f));
          *(uint *)msp = uVar17;
        }
        else {
          if ((uVar31 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar31 + 0x18) != lVar28))
          goto LAB_0013519f;
          *(ulong *)(uVar31 + 0x18) = uVar24;
          *(ulong *)(uVar24 + 0x10) = uVar31;
        }
        uVar31 = (ulong)(uVar6 << 3);
        uVar24 = uVar31 - uVar25;
        if (uVar24 < 0x20) {
          *(ulong *)(lVar28 + 8) = uVar31 | 3;
          pbVar1 = (byte *)(lVar28 + 8 + uVar31);
          *pbVar1 = *pbVar1 | 1;
          return (void *)(lVar28 + 0x10);
        }
        *(ulong *)(lVar28 + 8) = uVar25 | 3;
        *(ulong *)(lVar28 + 8 + uVar25) = uVar24 | 1;
        *(ulong *)(lVar28 + uVar31) = uVar24;
        if (uVar18 != 0) {
          lVar26 = *(long *)((long)msp + 0x20);
          uVar22 = (uint)(uVar18 >> 3);
          uVar18 = (long)msp + (ulong)(uVar22 * 2) * 8 + 0x48;
          if ((uVar17 >> (uVar22 & 0x1f) & 1) == 0) {
            *(uint *)msp = uVar17 | 1 << (uVar22 & 0x1f);
            uVar31 = uVar18;
          }
          else {
            uVar31 = *(ulong *)(uVar18 + 0x10);
            if (*(ulong *)(uVar18 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
          }
          *(long *)(uVar18 + 0x10) = lVar26;
          *(long *)(uVar31 + 0x18) = lVar26;
          *(ulong *)(lVar26 + 0x10) = uVar31;
          *(ulong *)(lVar26 + 0x18) = uVar18;
        }
        *(ulong *)((long)msp + 8) = uVar24;
        *(ulong *)((long)msp + 0x20) = lVar28 + uVar25;
        return (void *)(lVar28 + 0x10);
      }
      uVar22 = *(uint *)((long)msp + 4);
      if (uVar22 != 0) {
        uVar21 = 0;
        for (uVar6 = uVar22; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x80000000) {
          uVar21 = uVar21 + 1;
        }
        puVar12 = *(undefined8 **)((long)msp + (ulong)uVar21 * 8 + 600);
        uVar24 = (puVar12[1] & 0xfffffffffffffff8) - uVar25;
        puVar29 = puVar12;
        while ((puVar30 = (undefined8 *)puVar29[4], puVar30 != (undefined8 *)0x0 ||
               (puVar30 = (undefined8 *)puVar29[5], puVar30 != (undefined8 *)0x0))) {
          uVar31 = (puVar30[1] & 0xfffffffffffffff8) - uVar25;
          puVar29 = puVar30;
          if (uVar31 < uVar24) {
            puVar12 = puVar30;
            uVar24 = uVar31;
          }
        }
        puVar29 = *(undefined8 **)((long)msp + 0x18);
        if (puVar12 < puVar29) goto LAB_0013519f;
        puVar30 = (undefined8 *)puVar12[3];
        uVar31 = puVar12[6];
        if (puVar30 == puVar12) {
          if ((undefined8 *)puVar12[5] == (undefined8 *)0x0) {
            if ((undefined8 *)puVar12[4] == (undefined8 *)0x0) {
              puVar30 = (undefined8 *)0x0;
              goto LAB_001343b7;
            }
            puVar10 = (undefined8 *)puVar12[4];
            puVar3 = puVar12 + 4;
          }
          else {
            puVar10 = (undefined8 *)puVar12[5];
            puVar3 = puVar12 + 5;
          }
          do {
            do {
              puVar32 = puVar3;
              puVar30 = puVar10;
              puVar10 = (undefined8 *)puVar30[5];
              puVar3 = puVar30 + 5;
            } while ((undefined8 *)puVar30[5] != (undefined8 *)0x0);
            puVar10 = (undefined8 *)puVar30[4];
            puVar3 = puVar30 + 4;
          } while ((undefined8 *)puVar30[4] != (undefined8 *)0x0);
          if (puVar32 < puVar29) goto LAB_0013519f;
          *puVar32 = 0;
        }
        else {
          puVar10 = (undefined8 *)puVar12[2];
          if (((puVar10 < puVar29) || ((undefined8 *)puVar10[3] != puVar12)) ||
             ((undefined8 *)puVar30[2] != puVar12)) goto LAB_0013519f;
          puVar10[3] = puVar30;
          puVar30[2] = puVar10;
        }
LAB_001343b7:
        if (uVar31 != 0) {
          uVar21 = *(uint *)(puVar12 + 7);
          if (puVar12 == *(undefined8 **)((long)msp + (ulong)uVar21 * 8 + 600)) {
            *(undefined8 **)((long)msp + (ulong)uVar21 * 8 + 600) = puVar30;
            if (puVar30 == (undefined8 *)0x0) {
              *(uint *)((long)msp + 4) = uVar22 & ~(1 << (uVar21 & 0x1f));
            }
            else {
LAB_001343fb:
              puVar29 = *(undefined8 **)((long)msp + 0x18);
              if (puVar30 < puVar29) goto LAB_0013519f;
              puVar30[6] = uVar31;
              puVar10 = (undefined8 *)puVar12[4];
              if (puVar10 != (undefined8 *)0x0) {
                if (puVar10 < puVar29) goto LAB_0013519f;
                puVar30[4] = puVar10;
                puVar10[6] = puVar30;
              }
              uVar31 = puVar12[5];
              if (uVar31 != 0) {
                if (uVar31 < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
                puVar30[5] = uVar31;
                *(undefined8 **)(uVar31 + 0x30) = puVar30;
              }
            }
          }
          else {
            if (uVar31 < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
            *(undefined8 **)
             (uVar31 + 0x20 + (ulong)(*(undefined8 **)(uVar31 + 0x20) != puVar12) * 8) = puVar30;
            if (puVar30 != (undefined8 *)0x0) goto LAB_001343fb;
          }
        }
        if (uVar24 < 0x20) {
          puVar12[1] = uVar24 + uVar25 | 3;
          pbVar1 = (byte *)((long)puVar12 + uVar24 + uVar25 + 8);
          *pbVar1 = *pbVar1 | 1;
        }
        else {
          puVar12[1] = uVar25 | 3;
          *(ulong *)((long)puVar12 + uVar25 + 8) = uVar24 | 1;
          *(ulong *)((long)puVar12 + uVar25 + uVar24) = uVar24;
          if (uVar18 != 0) {
            lVar28 = *(long *)((long)msp + 0x20);
            uVar22 = (uint)(uVar18 >> 3);
            uVar18 = (long)msp + (ulong)(uVar22 * 2) * 8 + 0x48;
            if ((uVar17 >> (uVar22 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << (uVar22 & 0x1f) | uVar17;
              uVar31 = uVar18;
            }
            else {
              uVar31 = *(ulong *)(uVar18 + 0x10);
              if (*(ulong *)(uVar18 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
            }
            *(long *)(uVar18 + 0x10) = lVar28;
            *(long *)(uVar31 + 0x18) = lVar28;
            *(ulong *)(lVar28 + 0x10) = uVar31;
            *(ulong *)(lVar28 + 0x18) = uVar18;
          }
          *(ulong *)((long)msp + 8) = uVar24;
          *(ulong *)((long)msp + 0x20) = (long)puVar12 + uVar25;
        }
        goto LAB_001345ea;
      }
    }
  }
  else if (bytes < 0xffffffffffffff80) {
    uVar17 = *(uint *)((long)msp + 4);
    uVar25 = bytes + 0x17 & 0xfffffffffffffff0;
    if (uVar17 != 0) {
      uVar22 = (uint)(bytes + 0x17 >> 8);
      if (uVar22 == 0) {
        uVar18 = 0;
      }
      else if (uVar22 < 0x10000) {
        uVar18 = (ulong)(((uint)(uVar25 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar22)) & 0x3f)) & 1
                         ) + LZCOUNT(uVar22) * 2 ^ 0x3e);
      }
      else {
        uVar18 = 0x1f;
      }
      puVar29 = *(undefined8 **)((long)msp + uVar18 * 8 + 600);
      uVar24 = -uVar25;
      if (puVar29 == (undefined8 *)0x0) {
        puVar30 = (undefined8 *)0x0;
        puVar12 = (undefined8 *)0x0;
      }
      else {
        uVar31 = (ulong)(byte)(0x39 - (char)(uVar18 >> 1));
        if ((uint)uVar18 == 0x1f) {
          uVar31 = 0;
        }
        puVar10 = (undefined8 *)0x0;
        lVar28 = uVar25 << (uVar31 & 0x3f);
        puVar30 = (undefined8 *)0x0;
        do {
          puVar12 = puVar29;
          uVar31 = (puVar12[1] & 0xfffffffffffffff8) - uVar25;
          if ((uVar31 < uVar24) && (puVar10 = puVar12, uVar24 = uVar31, uVar31 == 0)) {
            uVar24 = 0;
            puVar30 = puVar12;
            goto LAB_00134ea3;
          }
          puVar3 = (undefined8 *)puVar12[5];
          puVar29 = (undefined8 *)puVar12[4 - (lVar28 >> 0x3f)];
          puVar12 = puVar3;
          if (puVar3 == puVar29) {
            puVar12 = puVar30;
          }
          if (puVar3 != (undefined8 *)0x0) {
            puVar30 = puVar12;
          }
          lVar28 = lVar28 * 2;
          puVar12 = puVar10;
        } while (puVar29 != (undefined8 *)0x0);
      }
      if (puVar30 != (undefined8 *)0x0 || puVar12 != (undefined8 *)0x0) goto LAB_00134ea3;
      uVar21 = (uint)uVar18 & 0x1f;
      uVar22 = 2 << uVar21;
      uVar22 = (-uVar22 | uVar22) & uVar17;
      if (uVar22 == 0) {
        puVar12 = (undefined8 *)0x0;
        puVar30 = (undefined8 *)(ulong)(uint)(0 << uVar21);
        goto LAB_00134ea3;
      }
      uVar21 = 0;
      for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
        uVar21 = uVar21 + 1;
      }
      puVar29 = (undefined8 *)((long)msp + (ulong)uVar21 * 8 + 600);
      puVar12 = (undefined8 *)0x0;
LAB_00134ea0:
      puVar30 = (undefined8 *)*puVar29;
LAB_00134ea3:
      while (puVar29 = puVar30, puVar29 != (undefined8 *)0x0) {
        uVar18 = (puVar29[1] & 0xfffffffffffffff8) - uVar25;
        if (uVar18 < uVar24) {
          puVar12 = puVar29;
          uVar24 = uVar18;
        }
        puVar30 = (undefined8 *)puVar29[4];
        if ((undefined8 *)puVar29[4] == (undefined8 *)0x0) goto code_r0x00134eca;
      }
      if ((puVar12 == (undefined8 *)0x0) || (*(long *)((long)msp + 8) - uVar25 <= uVar24))
      goto LAB_001344e6;
      puVar29 = *(undefined8 **)((long)msp + 0x18);
      if ((puVar12 < puVar29) || ((long)uVar25 < 1)) goto LAB_0013519f;
      puVar30 = (undefined8 *)puVar12[3];
      uVar18 = puVar12[6];
      if (puVar30 != puVar12) {
        puVar10 = (undefined8 *)puVar12[2];
        if (((puVar10 < puVar29) || ((undefined8 *)puVar10[3] != puVar12)) ||
           ((undefined8 *)puVar30[2] != puVar12)) goto LAB_0013519f;
        puVar10[3] = puVar30;
        puVar30[2] = puVar10;
        goto LAB_00134f84;
      }
      if ((undefined8 *)puVar12[5] != (undefined8 *)0x0) {
        puVar10 = (undefined8 *)puVar12[5];
        puVar3 = puVar12 + 5;
        goto LAB_00134f57;
      }
      if ((undefined8 *)puVar12[4] == (undefined8 *)0x0) {
        puVar30 = (undefined8 *)0x0;
        goto LAB_00134f84;
      }
      puVar10 = (undefined8 *)puVar12[4];
      puVar3 = puVar12 + 4;
LAB_00134f57:
      do {
        do {
          puVar32 = puVar3;
          puVar30 = puVar10;
          puVar10 = (undefined8 *)puVar30[5];
          puVar3 = puVar30 + 5;
        } while ((undefined8 *)puVar30[5] != (undefined8 *)0x0);
        puVar10 = (undefined8 *)puVar30[4];
        puVar3 = puVar30 + 4;
      } while ((undefined8 *)puVar30[4] != (undefined8 *)0x0);
      if (puVar32 < puVar29) goto LAB_0013519f;
      *puVar32 = 0;
LAB_00134f84:
      if (uVar18 != 0) {
        uVar22 = *(uint *)(puVar12 + 7);
        if (puVar12 == *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600)) {
          *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600) = puVar30;
          if (puVar30 == (undefined8 *)0x0) {
            *(uint *)((long)msp + 4) = uVar17 & ~(1 << (uVar22 & 0x1f));
          }
          else {
LAB_00134fc0:
            puVar29 = *(undefined8 **)((long)msp + 0x18);
            if (puVar30 < puVar29) goto LAB_0013519f;
            puVar30[6] = uVar18;
            puVar10 = (undefined8 *)puVar12[4];
            if (puVar10 != (undefined8 *)0x0) {
              if (puVar10 < puVar29) goto LAB_0013519f;
              puVar30[4] = puVar10;
              puVar10[6] = puVar30;
            }
            uVar18 = puVar12[5];
            if (uVar18 != 0) {
              if (uVar18 < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
              puVar30[5] = uVar18;
              *(undefined8 **)(uVar18 + 0x30) = puVar30;
            }
          }
        }
        else {
          if (uVar18 < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
          *(undefined8 **)(uVar18 + 0x20 + (ulong)(*(undefined8 **)(uVar18 + 0x20) != puVar12) * 8)
               = puVar30;
          if (puVar30 != (undefined8 *)0x0) goto LAB_00134fc0;
        }
      }
      if (uVar24 < 0x20) {
        puVar12[1] = uVar24 + uVar25 | 3;
        pbVar1 = (byte *)((long)puVar12 + uVar24 + uVar25 + 8);
        *pbVar1 = *pbVar1 | 1;
      }
      else {
        lVar28 = (long)puVar12 + uVar25;
        puVar12[1] = uVar25 | 3;
        *(ulong *)((long)puVar12 + uVar25 + 8) = uVar24 | 1;
        *(ulong *)(lVar28 + uVar24) = uVar24;
        if (uVar24 < 0x100) {
          uVar25 = (long)msp + (uVar24 >> 3) * 0x10 + 0x48;
          uVar17 = (uint)(uVar24 >> 3);
          if ((*msp >> (uVar17 & 0x1f) & 1) == 0) {
            *(uint *)msp = *msp | 1 << (uVar17 & 0x1f);
            uVar18 = uVar25;
          }
          else {
            uVar18 = *(ulong *)(uVar25 + 0x10);
            if (*(ulong *)(uVar25 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
          }
          *(long *)(uVar25 + 0x10) = lVar28;
          *(long *)(uVar18 + 0x18) = lVar28;
          *(ulong *)(lVar28 + 0x10) = uVar18;
          *(ulong *)(lVar28 + 0x18) = uVar25;
          goto LAB_001345ea;
        }
        uVar17 = (uint)(uVar24 >> 8);
        if (uVar17 == 0) {
          uVar17 = 0;
        }
        else if (uVar17 < 0x10000) {
          uVar17 = ((uint)(uVar24 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar17)) & 0x3f)) & 1) +
                   LZCOUNT(uVar17) * 2 ^ 0x3e;
        }
        else {
          uVar17 = 0x1f;
        }
        *(uint *)(lVar28 + 0x38) = uVar17;
        plVar20 = (long *)((long)msp + (ulong)uVar17 * 8 + 600);
        *(undefined1 (*) [16])(lVar28 + 0x20) = (undefined1  [16])0x0;
        if ((*(uint *)((long)msp + 4) >> (uVar17 & 0x1f) & 1) == 0) {
          *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar17 & 0x1f);
          *plVar20 = lVar28;
        }
        else {
          uVar25 = (ulong)(byte)(0x39 - (char)(uVar17 >> 1));
          if (uVar17 == 0x1f) {
            uVar25 = 0;
          }
          lVar26 = uVar24 << (uVar25 & 0x3f);
          plVar14 = (long *)*plVar20;
          do {
            plVar20 = plVar14;
            if ((plVar20[1] & 0xfffffffffffffff8U) == uVar24) {
              if ((*(long **)((long)msp + 0x18) <= plVar20) &&
                 (plVar14 = (long *)plVar20[2], *(long **)((long)msp + 0x18) <= plVar14)) {
                plVar14[3] = lVar28;
                plVar20[2] = lVar28;
                *(long **)(lVar28 + 0x10) = plVar14;
                *(long **)(lVar28 + 0x18) = plVar20;
                *(undefined8 *)(lVar28 + 0x30) = 0;
                goto LAB_001345ea;
              }
              goto LAB_0013519f;
            }
            lVar7 = lVar26 >> 0x3f;
            lVar26 = lVar26 * 2;
            plVar14 = (long *)plVar20[4 - lVar7];
          } while ((long *)plVar20[4 - lVar7] != (long *)0x0);
          if (plVar20 + (4 - lVar7) < *(long **)((long)msp + 0x18)) goto LAB_0013519f;
          plVar20[4 - lVar7] = lVar28;
        }
        *(long **)(lVar28 + 0x30) = plVar20;
        *(long *)(lVar28 + 0x18) = lVar28;
        *(long *)(lVar28 + 0x10) = lVar28;
      }
      goto LAB_001345ea;
    }
  }
  else {
    uVar25 = 0xffffffffffffffff;
  }
LAB_001344e6:
  uVar18 = *(ulong *)((long)msp + 8);
  uVar24 = uVar18 - uVar25;
  if (uVar25 <= uVar18) {
    puVar12 = *(undefined8 **)((long)msp + 0x20);
    if (uVar24 < 0x20) {
      lVar28 = 0;
      puVar12[1] = uVar18 | 3;
      pbVar1 = (byte *)((long)puVar12 + uVar18 + 8);
      *pbVar1 = *pbVar1 | 1;
      uVar24 = 0;
    }
    else {
      lVar28 = (long)puVar12 + uVar25;
      *(ulong *)((long)puVar12 + uVar25 + 8) = uVar24 | 1;
      *(ulong *)((long)puVar12 + uVar18) = uVar24;
      puVar12[1] = uVar25 | 3;
    }
    *(long *)((long)msp + 0x20) = lVar28;
    *(ulong *)((long)msp + 8) = uVar24;
    goto LAB_001345ea;
  }
  uVar18 = *(ulong *)((long)msp + 0x10) - uVar25;
  if (*(ulong *)((long)msp + 0x10) < uVar25 || uVar18 == 0) {
    if (mparams.magic == 0) {
      init_mparams();
    }
    if ((((*(byte *)((long)msp + 0x370) & 1) != 0) && (mparams.mmap_threshold <= uVar25)) &&
       (*(long *)((long)msp + 0x10) != 0)) {
      uVar18 = -mparams.page_size & uVar25 + 0x3e + mparams.page_size;
      if (*(ulong *)((long)msp + 0x368) == 0) {
        if (uVar25 < uVar18) goto LAB_00134609;
      }
      else {
        uVar24 = *(ulong *)((long)msp + 0x358) + uVar18;
        if ((uVar25 < uVar18 && *(ulong *)((long)msp + 0x358) < uVar24) &&
            uVar24 <= *(ulong *)((long)msp + 0x368)) {
LAB_00134609:
          pvVar11 = mmap((void *)0x0,uVar18,3,0x22,-1,0);
          if (pvVar11 != (void *)0xffffffffffffffff) {
            uVar25 = (ulong)(-(int)pvVar11 - 0x10U & 0xf);
            puVar12 = (undefined8 *)((long)pvVar11 + uVar25);
            *(ulong *)((long)pvVar11 + uVar25) = uVar25;
            *(ulong *)((long)pvVar11 + uVar25 + 8) = (uVar18 - uVar25) + -0x20;
            *(undefined8 *)((uVar18 - uVar25) + -0x18 + (long)puVar12) = 0xb;
            *(undefined8 *)((long)pvVar11 + (uVar18 - 0x10)) = 0;
            if ((*(void **)((long)msp + 0x18) == (void *)0x0) ||
               (pvVar11 < *(void **)((long)msp + 0x18))) {
              *(void **)((long)msp + 0x18) = pvVar11;
            }
            uVar18 = uVar18 + *(long *)((long)msp + 0x358);
            *(ulong *)((long)msp + 0x358) = uVar18;
            if (*(ulong *)((long)msp + 0x360) < uVar18) {
              *(ulong *)((long)msp + 0x360) = uVar18;
            }
            goto LAB_001345ea;
          }
        }
      }
    }
    uVar18 = -mparams.granularity & uVar25 + 0x5f + mparams.granularity;
    if (uVar18 <= uVar25) {
      return (void *)0x0;
    }
    if ((*(ulong *)((long)msp + 0x368) != 0) &&
       (uVar24 = *(ulong *)((long)msp + 0x358) + uVar18,
       *(ulong *)((long)msp + 0x368) < uVar24 || uVar24 <= *(ulong *)((long)msp + 0x358))) {
      return (void *)0x0;
    }
    pmVar13 = (mchunkptr)mmap((void *)0x0,uVar18,3,0x22,-1,0);
    if (pmVar13 == (mchunkptr)0xffffffffffffffff) goto LAB_00134ba8;
    uVar24 = *(long *)((long)msp + 0x358) + uVar18;
    *(ulong *)((long)msp + 0x358) = uVar24;
    if (*(ulong *)((long)msp + 0x360) < uVar24) {
      *(ulong *)((long)msp + 0x360) = uVar24;
    }
    pmVar23 = *(mchunkptr *)((long)msp + 0x28);
    if (pmVar23 == (malloc_chunk *)0x0) {
      if ((*(mchunkptr *)((long)msp + 0x18) == (mchunkptr)0x0) ||
         (pmVar13 < *(mchunkptr *)((long)msp + 0x18))) {
        *(mchunkptr *)((long)msp + 0x18) = pmVar13;
      }
      *(mchunkptr *)((long)msp + 0x378) = pmVar13;
      *(ulong *)((long)msp + 0x380) = uVar18;
      *(undefined4 *)((long)msp + 0x390) = 1;
      *(size_t *)((long)msp + 0x40) = mparams.magic;
      *(undefined8 *)((long)msp + 0x38) = 0xfff;
      init_bins((mstate)msp);
      pmVar23 = (mchunkptr)((long)msp + ((*(ulong *)((long)msp + -8) & 0xfffffffffffffff8) - 0x10));
      sVar33 = (long)pmVar13 + (uVar18 - (long)pmVar23) + -0x50;
LAB_001347ec:
      init_top((mstate)msp,pmVar23,sVar33);
      goto LAB_00134b9b;
    }
    plVar20 = (long *)((long)msp + 0x378);
    for (plVar14 = plVar20; plVar14 != (long *)0x0; plVar14 = (long *)plVar14[2]) {
      if (pmVar13 == (mchunkptr)((long)&((malloc_chunk *)*plVar14)->prev_foot + plVar14[1])) {
        if ((((pmVar23 < pmVar13) && ((malloc_chunk *)*plVar14 <= pmVar23)) &&
            ((*(uint *)(plVar14 + 3) & 8) == 0)) && ((*(uint *)(plVar14 + 3) & 1) != 0)) {
          plVar14[1] = plVar14[1] + uVar18;
          sVar33 = uVar18 + *(long *)((long)msp + 0x10);
          goto LAB_001347ec;
        }
        break;
      }
    }
    pmVar27 = *(mchunkptr *)((long)msp + 0x18);
    if (pmVar13 < *(mchunkptr *)((long)msp + 0x18)) {
      *(mchunkptr *)((long)msp + 0x18) = pmVar13;
      pmVar27 = pmVar13;
    }
    plVar14 = plVar20;
    while( true ) {
      if (plVar14 == (long *)0x0) goto LAB_00134901;
      lVar28 = *plVar14;
      if (lVar28 == (long)&pmVar13->prev_foot + uVar18) break;
      plVar14 = (long *)plVar14[2];
    }
    if (((~*(byte *)(plVar14 + 3) | *(byte *)(plVar14 + 3) >> 3) & 1) != 0) goto LAB_00134901;
    *plVar14 = (long)pmVar13;
    plVar14[1] = plVar14[1] + uVar18;
    uVar24 = (ulong)(-(int)pmVar13 - 0x10U & 0xf);
    puVar12 = (undefined8 *)((long)&pmVar13->prev_foot + uVar24);
    pmVar34 = (malloc_chunk *)((ulong)(-(int)lVar28 - 0x10U & 0xf) + lVar28);
    uVar18 = (long)puVar12 + uVar25;
    uVar31 = (long)pmVar34 - uVar18;
    *(ulong *)((long)&pmVar13->head + uVar24) = uVar25 | 3;
    if (pmVar34 == pmVar23) {
      uVar31 = uVar31 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar31;
      *(ulong *)((long)msp + 0x28) = uVar18;
      *(ulong *)(uVar18 + 8) = uVar31 | 1;
      goto LAB_001345ea;
    }
    if (pmVar34 == *(malloc_chunk **)((long)msp + 0x20)) {
      uVar31 = uVar31 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar31;
      *(ulong *)((long)msp + 0x20) = uVar18;
      *(ulong *)(uVar18 + 8) = uVar31 | 1;
      *(ulong *)(uVar18 + uVar31) = uVar31;
      goto LAB_001345ea;
    }
    uVar25 = pmVar34->head;
    pmVar19 = pmVar34;
    if (((uint)uVar25 & 3) != 1) goto LAB_00134d20;
    if (uVar25 < 0x100) {
      pmVar35 = pmVar34->fd;
      pmVar4 = pmVar34->bk;
      pmVar19 = (malloc_chunk *)((long)msp + (uVar25 >> 3) * 0x10 + 0x48);
      if ((pmVar35 != pmVar19) && ((pmVar35 < pmVar27 || (pmVar35->bk != pmVar34))))
      goto LAB_0013519f;
      if (pmVar4 == pmVar35) {
        bVar5 = (byte)(uVar25 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        goto LAB_00134d0d;
      }
      if ((pmVar4 != pmVar19) && ((pmVar4 < pmVar27 || (pmVar4->fd != pmVar34)))) goto LAB_0013519f;
      pmVar35->bk = pmVar4;
      pmVar4->fd = pmVar35;
      goto LAB_00134d0d;
    }
    pmVar19 = pmVar34->bk;
    pmVar35 = pmVar34[1].fd;
    if (pmVar19 != pmVar34) {
      pmVar13 = pmVar34->fd;
      if (((pmVar13 < pmVar27) || (pmVar13->bk != pmVar34)) || (pmVar19->fd != pmVar34))
      goto LAB_0013519f;
      pmVar13->bk = pmVar19;
      pmVar19->fd = pmVar13;
      goto LAB_00134c77;
    }
    if ((malloc_chunk *)pmVar34[1].head != (malloc_chunk *)0x0) {
      pmVar4 = (malloc_chunk *)pmVar34[1].head;
      pmVar13 = (mchunkptr)&pmVar34[1].head;
      goto LAB_00134c47;
    }
    if ((malloc_chunk *)pmVar34[1].prev_foot == (malloc_chunk *)0x0) {
      pmVar19 = (malloc_chunk *)0x0;
      goto LAB_00134c77;
    }
    pmVar4 = (malloc_chunk *)pmVar34[1].prev_foot;
    pmVar13 = pmVar34 + 1;
LAB_00134c47:
    do {
      do {
        pmVar23 = pmVar13;
        pmVar19 = pmVar4;
        pmVar4 = (malloc_chunk *)pmVar19[1].head;
        pmVar13 = (mchunkptr)&pmVar19[1].head;
      } while ((malloc_chunk *)pmVar19[1].head != (malloc_chunk *)0x0);
      pmVar4 = (malloc_chunk *)pmVar19[1].prev_foot;
      pmVar13 = pmVar19 + 1;
    } while ((malloc_chunk *)pmVar19[1].prev_foot != (malloc_chunk *)0x0);
    if (pmVar23 < pmVar27) goto LAB_0013519f;
    pmVar23->prev_foot = 0;
LAB_00134c77:
    if (pmVar35 != (malloc_chunk *)0x0) {
      uVar17 = *(uint *)&pmVar34[1].bk;
      if (pmVar34 == *(malloc_chunk **)((long)msp + (ulong)uVar17 * 8 + 600)) {
        *(malloc_chunk **)((long)msp + (ulong)uVar17 * 8 + 600) = pmVar19;
        if (pmVar19 == (malloc_chunk *)0x0) {
          bVar5 = (byte)uVar17 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        }
        else {
LAB_00134cba:
          pmVar4 = *(malloc_chunk **)((long)msp + 0x18);
          if (pmVar19 < pmVar4) goto LAB_0013519f;
          pmVar19[1].fd = pmVar35;
          pmVar35 = (malloc_chunk *)pmVar34[1].prev_foot;
          if (pmVar35 != (malloc_chunk *)0x0) {
            if (pmVar35 < pmVar4) goto LAB_0013519f;
            pmVar19[1].prev_foot = (size_t)pmVar35;
            pmVar35[1].fd = pmVar19;
          }
          uVar24 = pmVar34[1].head;
          if (uVar24 != 0) {
            if (uVar24 < *(ulong *)((long)msp + 0x18)) goto LAB_0013519f;
            pmVar19[1].head = uVar24;
            *(malloc_chunk **)(uVar24 + 0x30) = pmVar19;
          }
        }
      }
      else {
        if (pmVar35 < *(malloc_chunk **)((long)msp + 0x18)) goto LAB_0013519f;
        (&pmVar35[1].prev_foot)[(malloc_chunk *)pmVar35[1].prev_foot != pmVar34] = (size_t)pmVar19;
        if (pmVar19 != (malloc_chunk *)0x0) goto LAB_00134cba;
      }
    }
LAB_00134d0d:
    uVar25 = uVar25 & 0xfffffffffffffff8;
    pmVar19 = (malloc_chunk *)((long)&pmVar34->prev_foot + uVar25);
    uVar31 = uVar31 + uVar25;
    uVar25 = *(ulong *)((long)&pmVar34->head + uVar25);
LAB_00134d20:
    pmVar19->head = uVar25 & 0xfffffffffffffffe;
    *(ulong *)(uVar18 + 8) = uVar31 | 1;
    *(ulong *)(uVar18 + uVar31) = uVar31;
    if (uVar31 < 0x100) {
      uVar25 = (long)msp + (uVar31 >> 3) * 0x10 + 0x48;
      uVar17 = (uint)(uVar31 >> 3);
      if ((*msp >> (uVar17 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << (uVar17 & 0x1f);
        uVar24 = uVar25;
      }
      else {
        uVar24 = *(ulong *)(uVar25 + 0x10);
        if (*(ulong *)(uVar25 + 0x10) < *(ulong *)((long)msp + 0x18)) {
LAB_0013519f:
          abort();
        }
      }
      *(ulong *)(uVar25 + 0x10) = uVar18;
      *(ulong *)(uVar24 + 0x18) = uVar18;
      *(ulong *)(uVar18 + 0x10) = uVar24;
      *(ulong *)(uVar18 + 0x18) = uVar25;
    }
    else {
      uVar17 = (uint)(uVar31 >> 8);
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else if (uVar17 < 0x10000) {
        uVar17 = ((uint)(uVar31 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar17)) & 0x3f)) & 1) +
                 LZCOUNT(uVar17) * 2 ^ 0x3e;
      }
      else {
        uVar17 = 0x1f;
      }
      *(uint *)(uVar18 + 0x38) = uVar17;
      puVar2 = (ulong *)((long)msp + (ulong)uVar17 * 8 + 600);
      *(undefined1 (*) [16])(uVar18 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> (uVar17 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar17 & 0x1f);
        *puVar2 = uVar18;
        *(ulong **)(uVar18 + 0x30) = puVar2;
      }
      else {
        uVar25 = (ulong)(byte)(0x39 - (char)(uVar17 >> 1));
        if (uVar17 == 0x1f) {
          uVar25 = 0;
        }
        lVar28 = uVar31 << (uVar25 & 0x3f);
        uVar25 = *puVar2;
        do {
          uVar24 = uVar25;
          if ((*(ulong *)(uVar24 + 8) & 0xfffffffffffffff8) == uVar31) {
            if ((uVar24 < *(ulong *)((long)msp + 0x18)) ||
               (uVar25 = *(ulong *)(uVar24 + 0x10), uVar25 < *(ulong *)((long)msp + 0x18)))
            goto LAB_0013519f;
            *(ulong *)(uVar25 + 0x18) = uVar18;
            *(ulong *)(uVar24 + 0x10) = uVar18;
            *(ulong *)(uVar18 + 0x10) = uVar25;
            *(ulong *)(uVar18 + 0x18) = uVar24;
            *(undefined8 *)(uVar18 + 0x30) = 0;
            goto LAB_001345ea;
          }
          lVar26 = lVar28 >> 0x3f;
          lVar28 = lVar28 * 2;
          uVar25 = *(ulong *)(uVar24 + 0x20 + lVar26 * -8);
        } while (uVar25 != 0);
        puVar2 = (ulong *)(uVar24 + 0x20 + lVar26 * -8);
        if (puVar2 < *(ulong **)((long)msp + 0x18)) goto LAB_0013519f;
        *puVar2 = uVar18;
        *(ulong *)(uVar18 + 0x30) = uVar24;
      }
      *(ulong *)(uVar18 + 0x18) = uVar18;
      *(ulong *)(uVar18 + 0x10) = uVar18;
    }
    goto LAB_001345ea;
  }
  goto LAB_001344fb;
code_r0x00134eca:
  puVar29 = puVar29 + 5;
  goto LAB_00134ea0;
LAB_00134901:
  pmVar15 = segment_holding((mstate)msp,(char *)pmVar23);
  pmVar35 = (malloc_chunk *)(pmVar15->base + pmVar15->size);
  pmVar19 = (malloc_chunk *)(((ulong)(0x4fU - (int)pmVar35 & 0xf) - 0x5f) + (long)pmVar35);
  pmVar34 = pmVar23 + 1;
  if (pmVar19 < pmVar34) {
    pmVar19 = pmVar23;
  }
  init_top((mstate)msp,pmVar13,uVar18 - 0x50);
  pmVar19->head = 0x33;
  auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar37 = vpbroadcastq_avx512f(ZEXT816(0xb));
  pmVar4 = *(malloc_chunk **)((long)msp + 0x380);
  sVar33 = *(size_t *)((long)msp + 0x388);
  sVar8 = *(size_t *)((long)msp + 0x390);
  pmVar19->fd = (malloc_chunk *)*plVar20;
  pmVar19->bk = pmVar4;
  pmVar19[1].prev_foot = sVar33;
  pmVar19[1].head = sVar8;
  *(mchunkptr *)((long)msp + 0x378) = pmVar13;
  *(ulong *)((long)msp + 0x380) = uVar18;
  *(uint *)((long)msp + 0x390) = (uint)(pmVar13 != (mchunkptr)0xffffffffffffffff);
  *(malloc_chunk ***)((long)msp + 0x388) = &pmVar19->fd;
  if (pmVar35 <= pmVar19 + 2) {
    pmVar35 = pmVar19 + 2;
  }
  uVar18 = 0;
  auVar38 = vpbroadcastq_avx512f();
  auVar38 = vpsrlq_avx512f(auVar38,3);
  do {
    auVar39 = vpbroadcastq_avx512f();
    auVar39 = vporq_avx512f(auVar39,auVar36);
    vpcmpuq_avx512f(auVar39,auVar38,2);
    auVar39 = vmovdqu64_avx512f(auVar37);
    *(undefined1 (*) [64])(&pmVar19[1].bk + uVar18) = auVar39;
    uVar18 = uVar18 + 8;
  } while ((((ulong)((long)pmVar35 + (-0x39 - (long)pmVar19)) >> 3) + 8 & 0xfffffffffffffff8) !=
           uVar18);
  uVar18 = (long)pmVar19 - (long)pmVar23;
  if (uVar18 != 0) {
    *(byte *)&pmVar19->head = (byte)pmVar19->head & 0xfe;
    pmVar23->head = uVar18 | 1;
    pmVar19->prev_foot = uVar18;
    if (uVar18 < 0x100) {
      pmVar34 = (malloc_chunk *)((long)msp + (uVar18 >> 3) * 0x10 + 0x48);
      uVar17 = (uint)(uVar18 >> 3);
      if ((*msp >> (uVar17 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << (uVar17 & 0x1f);
        pmVar19 = pmVar34;
      }
      else {
        pmVar19 = pmVar34->fd;
        if (pmVar34->fd < *(malloc_chunk **)((long)msp + 0x18)) goto LAB_0013519f;
      }
      pmVar34->fd = pmVar23;
      pmVar19->bk = pmVar23;
      lVar28 = 0x18;
      lVar26 = 0x10;
    }
    else {
      uVar17 = (uint)(uVar18 >> 8);
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else if (uVar17 < 0x10000) {
        uVar17 = ((uint)(uVar18 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar17)) & 0x3f)) & 1) +
                 LZCOUNT(uVar17) * 2 ^ 0x3e;
      }
      else {
        uVar17 = 0x1f;
      }
      *(uint *)&pmVar23[1].bk = uVar17;
      pmVar19 = (malloc_chunk *)((long)msp + (ulong)uVar17 * 8 + 600);
      pmVar34->prev_foot = 0;
      pmVar34->head = 0;
      if ((*(uint *)((long)msp + 4) >> (uVar17 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar17 & 0x1f);
        pmVar19->prev_foot = (size_t)pmVar23;
        pmVar23[1].fd = pmVar19;
      }
      else {
        uVar24 = (ulong)(byte)(0x39 - (char)(uVar17 >> 1));
        if (uVar17 == 0x1f) {
          uVar24 = 0;
        }
        lVar28 = uVar18 << (uVar24 & 0x3f);
        pmVar34 = (malloc_chunk *)pmVar19->prev_foot;
        do {
          pmVar19 = pmVar34;
          if ((pmVar19->head & 0xfffffffffffffff8) == uVar18) {
            if ((pmVar19 < *(malloc_chunk **)((long)msp + 0x18)) ||
               (pmVar34 = pmVar19->fd, pmVar34 < *(malloc_chunk **)((long)msp + 0x18)))
            goto LAB_0013519f;
            pmVar34->bk = pmVar23;
            pmVar19->fd = pmVar23;
            pmVar23->fd = pmVar34;
            lVar28 = 0x30;
            lVar26 = 0x18;
            pmVar34 = (malloc_chunk *)0x0;
            goto LAB_00134b93;
          }
          lVar26 = lVar28 >> 0x3f;
          lVar28 = lVar28 * 2;
          pmVar34 = *(malloc_chunk **)((long)pmVar19 + lVar26 * -8 + 0x20);
        } while (pmVar34 != (malloc_chunk *)0x0);
        puVar29 = (undefined8 *)((long)pmVar19 + lVar26 * -8 + 0x20);
        if (puVar29 < *(undefined8 **)((long)msp + 0x18)) goto LAB_0013519f;
        *puVar29 = pmVar23;
        pmVar23[1].fd = pmVar19;
      }
      lVar28 = 0x10;
      lVar26 = 0x18;
      pmVar19 = pmVar23;
      pmVar34 = pmVar23;
    }
LAB_00134b93:
    *(malloc_chunk **)((long)&pmVar23->prev_foot + lVar26) = pmVar19;
    *(malloc_chunk **)((long)&pmVar23->prev_foot + lVar28) = pmVar34;
  }
LAB_00134b9b:
  uVar18 = *(ulong *)((long)msp + 0x10) - uVar25;
  if (*(ulong *)((long)msp + 0x10) < uVar25 || uVar18 == 0) {
LAB_00134ba8:
    piVar16 = __errno_location();
    *piVar16 = 0xc;
    return (void *)0x0;
  }
LAB_001344fb:
  *(ulong *)((long)msp + 0x10) = uVar18;
  puVar12 = *(undefined8 **)((long)msp + 0x28);
  *(ulong *)((long)msp + 0x28) = (long)puVar12 + uVar25;
  *(ulong *)((long)puVar12 + uVar25 + 8) = uVar18 | 1;
  puVar12[1] = uVar25 | 3;
LAB_001345ea:
  return puVar12 + 2;
}

Assistant:

void* mspace_malloc(mspace msp, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (!PREACTION(ms)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = ms->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(ms, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(ms, b, p, idx);
        set_inuse_and_pinuse(ms, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }

      else if (nb > ms->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(ms, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(ms, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(ms, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(ms, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }

        else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }
    }

    if (nb <= ms->dvsize) {
      size_t rsize = ms->dvsize - nb;
      mchunkptr p = ms->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
        ms->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = ms->dvsize;
        ms->dvsize = 0;
        ms->dv = 0;
        set_inuse_and_pinuse(ms, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    else if (nb < ms->topsize) { /* Split top */
      size_t rsize = ms->topsize -= nb;
      mchunkptr p = ms->top;
      mchunkptr r = ms->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(ms, ms->top);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(ms, nb);

  postaction:
    POSTACTION(ms);
    return mem;
  }

  return 0;
}